

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderRectFilledRangeH
               (ImDrawList *draw_list,ImRect *rect,ImU32 col,float x_start_norm,float x_end_norm,
               float rounding)

{
  float *in_RSI;
  ImDrawList *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float x1;
  float arc1_e;
  float arc1_b;
  float x0;
  float half_pi;
  float arc0_e;
  float arc0_b;
  float inv_rounding;
  ImVec2 p1;
  ImVec2 p0;
  undefined4 in_stack_fffffffffffffee8;
  ImU32 in_stack_fffffffffffffeec;
  ImDrawList *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  ImVec2 *in_stack_ffffffffffffff00;
  ImVec2 *in_stack_ffffffffffffff08;
  int a_max_of_12;
  ImDrawList *in_stack_ffffffffffffff10;
  ImVec2 *in_stack_ffffffffffffff18;
  ImDrawList *in_stack_ffffffffffffff20;
  ImDrawList *in_stack_ffffffffffffff28;
  ImDrawList *in_stack_ffffffffffffff30;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  float local_80;
  float local_7c;
  float local_78;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  float local_44;
  undefined4 local_40;
  float local_3c;
  float local_38;
  float local_34;
  ImVec2 local_30;
  ImVec2 local_28;
  float local_20;
  float local_1c;
  float local_18 [2];
  float *local_10;
  undefined8 local_8;
  
  if ((in_XMM1_Da != in_XMM0_Da) || (NAN(in_XMM1_Da) || NAN(in_XMM0_Da))) {
    local_20 = in_XMM2_Da;
    local_1c = in_XMM1_Da;
    local_18[0] = in_XMM0_Da;
    local_10 = in_RSI;
    local_8 = in_RDI;
    if (in_XMM1_Da < in_XMM0_Da) {
      ImSwap<float>(local_18,&local_1c);
    }
    fVar1 = ImLerp<float>(*local_10,local_10[2],local_18[0]);
    ImVec2::ImVec2(&local_28,fVar1,local_10[1]);
    fVar1 = ImLerp<float>(*local_10,local_10[2],local_1c);
    ImVec2::ImVec2(&local_30,fVar1,local_10[3]);
    if ((local_20 != 0.0) || (NAN(local_20))) {
      fVar1 = ImMin<float>((local_10[2] - *local_10) * 0.5,(local_10[3] - local_10[1]) * 0.5);
      a_max_of_12 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      local_20 = ImClamp<float>(fVar1 - 1.0,0.0,local_20);
      local_34 = 1.0 / local_20;
      local_38 = ImAcos01(2.04415e-39);
      local_3c = ImAcos01(2.044252e-39);
      local_40 = 0x3fc90fdb;
      local_44 = ImMax<float>(local_28.x,*local_10 + local_20);
      if ((local_38 != local_3c) || (NAN(local_38) || NAN(local_3c))) {
        if ((((local_38 != 0.0) || (NAN(local_38))) || (local_3c != 1.5707964)) || (NAN(local_3c)))
        {
          in_stack_ffffffffffffff20 = local_8;
          ImVec2::ImVec2(&local_6c,local_44,local_30.y - local_20);
          ImDrawList::PathArcTo
                    (in_stack_ffffffffffffff30,(ImVec2 *)in_stack_ffffffffffffff28,
                     (float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                     SUB84(in_stack_ffffffffffffff20,0),
                     (float)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                     (int)in_stack_ffffffffffffff18);
          in_stack_ffffffffffffff28 = local_8;
          ImVec2::ImVec2(&local_74,local_44,local_28.y + local_20);
          ImDrawList::PathArcTo
                    (in_stack_ffffffffffffff30,(ImVec2 *)in_stack_ffffffffffffff28,
                     (float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                     SUB84(in_stack_ffffffffffffff20,0),
                     (float)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                     (int)in_stack_ffffffffffffff18);
        }
        else {
          in_stack_ffffffffffffff30 = local_8;
          ImVec2::ImVec2(&local_5c,local_44,local_30.y - local_20);
          ImDrawList::PathArcToFast
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     (float)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                     (int)in_stack_ffffffffffffff10,a_max_of_12);
          ImVec2::ImVec2(&local_64,local_44,local_28.y + local_20);
          ImDrawList::PathArcToFast
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     (float)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                     (int)in_stack_ffffffffffffff10,a_max_of_12);
        }
      }
      else {
        ImVec2::ImVec2(&local_4c,local_44,local_30.y);
        ImDrawList::PathLineTo
                  (in_stack_fffffffffffffef0,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        ImVec2::ImVec2(&local_54,local_44,local_28.y);
        ImDrawList::PathLineTo
                  (in_stack_fffffffffffffef0,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
      if (*local_10 + local_20 < local_30.x) {
        local_78 = ImAcos01(2.045395e-39);
        local_7c = ImAcos01(2.045499e-39);
        local_80 = ImMin<float>(local_30.x,local_10[2] - local_20);
        if ((local_78 != local_7c) || (NAN(local_78) || NAN(local_7c))) {
          if (((local_78 != 0.0) || ((NAN(local_78) || (local_7c != 1.5707964)))) || (NAN(local_7c))
             ) {
            ImVec2::ImVec2(&local_a8,local_80,local_28.y + local_20);
            ImDrawList::PathArcTo
                      (in_stack_ffffffffffffff30,(ImVec2 *)in_stack_ffffffffffffff28,
                       (float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                       SUB84(in_stack_ffffffffffffff20,0),
                       (float)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                       (int)in_stack_ffffffffffffff18);
            ImVec2::ImVec2(&local_b0,local_80,local_30.y - local_20);
            ImDrawList::PathArcTo
                      (in_stack_ffffffffffffff30,(ImVec2 *)in_stack_ffffffffffffff28,
                       (float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                       SUB84(in_stack_ffffffffffffff20,0),
                       (float)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                       (int)in_stack_ffffffffffffff18);
            in_stack_fffffffffffffef0 = local_8;
          }
          else {
            ImVec2::ImVec2(&local_98,local_80,local_28.y + local_20);
            ImDrawList::PathArcToFast
                      (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                       (float)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                       (int)in_stack_ffffffffffffff10,a_max_of_12);
            ImVec2::ImVec2(&local_a0,local_80,local_30.y - local_20);
            ImDrawList::PathArcToFast
                      (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                       (float)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                       (int)in_stack_ffffffffffffff10,local_8._4_4_);
          }
        }
        else {
          ImVec2::ImVec2(&local_88,local_80,local_28.y);
          ImDrawList::PathLineTo
                    (in_stack_fffffffffffffef0,
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          ImVec2::ImVec2(&local_90,local_80,local_30.y);
          ImDrawList::PathLineTo
                    (in_stack_fffffffffffffef0,
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        }
      }
      ImDrawList::PathFillConvex(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    }
    else {
      ImDrawList::AddRectFilled
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (ImU32)((ulong)in_stack_fffffffffffffef8 >> 0x20),(float)in_stack_fffffffffffffef8,
                 (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    }
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledRangeH(ImDrawList* draw_list, const ImRect& rect, ImU32 col, float x_start_norm, float x_end_norm, float rounding)
{
    if (x_end_norm == x_start_norm)
        return;
    if (x_start_norm > x_end_norm)
        ImSwap(x_start_norm, x_end_norm);

    ImVec2 p0 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_start_norm), rect.Min.y);
    ImVec2 p1 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_end_norm), rect.Max.y);
    if (rounding == 0.0f)
    {
        draw_list->AddRectFilled(p0, p1, col, 0.0f);
        return;
    }

    rounding = ImClamp(ImMin((rect.Max.x - rect.Min.x) * 0.5f, (rect.Max.y - rect.Min.y) * 0.5f) - 1.0f, 0.0f, rounding);
    const float inv_rounding = 1.0f / rounding;
    const float arc0_b = ImAcos01(1.0f - (p0.x - rect.Min.x) * inv_rounding);
    const float arc0_e = ImAcos01(1.0f - (p1.x - rect.Min.x) * inv_rounding);
    const float half_pi = IM_PI * 0.5f; // We will == compare to this because we know this is the exact value ImAcos01 can return.
    const float x0 = ImMax(p0.x, rect.Min.x + rounding);
    if (arc0_b == arc0_e)
    {
        draw_list->PathLineTo(ImVec2(x0, p1.y));
        draw_list->PathLineTo(ImVec2(x0, p0.y));
    }
    else if (arc0_b == 0.0f && arc0_e == half_pi)
    {
        draw_list->PathArcToFast(ImVec2(x0, p1.y - rounding), rounding, 3, 6); // BL
        draw_list->PathArcToFast(ImVec2(x0, p0.y + rounding), rounding, 6, 9); // TR
    }
    else
    {
        draw_list->PathArcTo(ImVec2(x0, p1.y - rounding), rounding, IM_PI - arc0_e, IM_PI - arc0_b, 3); // BL
        draw_list->PathArcTo(ImVec2(x0, p0.y + rounding), rounding, IM_PI + arc0_b, IM_PI + arc0_e, 3); // TR
    }
    if (p1.x > rect.Min.x + rounding)
    {
        const float arc1_b = ImAcos01(1.0f - (rect.Max.x - p1.x) * inv_rounding);
        const float arc1_e = ImAcos01(1.0f - (rect.Max.x - p0.x) * inv_rounding);
        const float x1 = ImMin(p1.x, rect.Max.x - rounding);
        if (arc1_b == arc1_e)
        {
            draw_list->PathLineTo(ImVec2(x1, p0.y));
            draw_list->PathLineTo(ImVec2(x1, p1.y));
        }
        else if (arc1_b == 0.0f && arc1_e == half_pi)
        {
            draw_list->PathArcToFast(ImVec2(x1, p0.y + rounding), rounding, 9, 12); // TR
            draw_list->PathArcToFast(ImVec2(x1, p1.y - rounding), rounding, 0, 3);  // BR
        }
        else
        {
            draw_list->PathArcTo(ImVec2(x1, p0.y + rounding), rounding, -arc1_e, -arc1_b, 3); // TR
            draw_list->PathArcTo(ImVec2(x1, p1.y - rounding), rounding, +arc1_b, +arc1_e, 3); // BR
        }
    }
    draw_list->PathFillConvex(col);
}